

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O0

size_t str_format(char *dst,size_t size,char *format,char **params,size_t nparams)

{
  char *__s1;
  int iVar1;
  char *__s;
  size_t sVar2;
  char *pcVar3;
  size_t __n;
  size_t local_a0;
  size_t bytes_1;
  size_t slen;
  char *key;
  char *val;
  size_t n;
  size_t keylen;
  char *token;
  size_t bytes;
  size_t space_needed;
  size_t space;
  char *write;
  char *copy;
  char *pos;
  size_t nparams_local;
  char **params_local;
  char *format_local;
  size_t size_local;
  char *dst_local;
  
  bytes = 0;
  space_needed = size;
  space = (size_t)dst;
  copy = format;
  do {
    pcVar3 = copy;
    if (*copy == '\0') {
LAB_00108da7:
      if (pcVar3 < copy) {
        sVar2 = str_strlcpy((char *)space,pcVar3,space_needed);
        bytes = sVar2 + bytes;
      }
      return bytes;
    }
    __s = strpbrk(copy,"{\\");
    if (__s == (char *)0x0) {
      sVar2 = str_strlcpy((char *)space,copy,space_needed);
      bytes = sVar2 + bytes;
      copy = (char *)0x0;
      goto LAB_00108da7;
    }
    pcVar3 = __s + -(long)copy;
    if (space_needed != 0) {
      token = pcVar3;
      if (space_needed <= pcVar3) {
        token = (char *)(space_needed - 1);
      }
      str_strlcpy((char *)space,copy,(size_t)(token + 1));
      space = (size_t)(token + space);
      space_needed = space_needed - (long)token;
    }
    if (*__s == '{') {
      copy = strchr(__s,0x7d);
      if (copy == (char *)0x0) {
        return 0;
      }
      __n = (long)copy - (long)(__s + 1);
      key = (char *)0x0;
      for (val = (char *)0x0; val != (char *)nparams; val = val + 1) {
        __s1 = params[(long)val];
        iVar1 = strncmp(__s1,__s + 1,__n);
        if ((iVar1 == 0) && (__s1[__n] == '\0')) {
          key = __s1 + __n + 1;
          break;
        }
      }
      if (key == (char *)0x0) {
        sVar2 = __n + 2;
        local_a0 = sVar2;
        if (space_needed <= sVar2) {
          local_a0 = space_needed - 1;
        }
        str_strlcpy((char *)space,__s,local_a0 + 1);
        space_needed = space_needed - local_a0;
      }
      else {
        sVar2 = str_strlcpy((char *)space,key,space_needed);
        if (sVar2 < space_needed) {
          space_needed = space_needed - sVar2;
          local_a0 = sVar2;
        }
        else {
          local_a0 = space_needed - 1;
          space_needed = 0;
        }
      }
      space = local_a0 + space;
      bytes = (long)pcVar3 + sVar2 + bytes;
    }
    else {
      bytes = (size_t)(pcVar3 + bytes + 1);
      copy = __s;
      if (__s[1] != '\0') {
        copy = __s + 1;
      }
      if (1 < space_needed) {
        *(char *)space = *copy;
        space_needed = space_needed - 1;
        space = space + 1;
      }
    }
    copy = copy + 1;
  } while( true );
}

Assistant:

size_t str_format(char *dst, size_t size, const char *format, const char *params[], size_t nparams)
{
    const char *pos, *copy = format;
    char *write = dst;

    size_t space = size;
    size_t space_needed = 0;

    for (pos = format; *pos; ++pos) {
        pos = strpbrk(pos, "{\\");
        if (!pos) {
            /* no more tokens, copy remainder of format string to output */
            space_needed += str_strlcpy(write, copy, space);
            break;
        }
        else {
            size_t bytes = pos - copy;
            /* found the start of a new token, copy `bytes` of lead text from [copy, pos) */
            space_needed += bytes;
            if (space > 0) {
                if (bytes >= space) {
                    bytes = space - 1;
                }
                str_strlcpy(write, copy, bytes + 1);
                write += bytes;
                space -= bytes;
            }
        }
        if (*pos == '{') {
            const char *token = pos + 1;

            copy = strchr(pos, '}');
            if (!copy) {
                /* syntax error: unterminated token */
                return 0;
            }
            else {
                /* found a token in the [token, copy) interval */
                size_t keylen = copy - token;
                size_t n;
                const char *val = NULL;
                for (n = 0; n != nparams; ++n) {
                    const char *key = params[n];
                    if (0 == strncmp(key, token, keylen)) {
                        /* param matches token? */
                        if (key[keylen] == '\0') {
                            val = key + keylen + 1;
                            break;
                        }
                    }
                }
                if (val) {
                    size_t slen = str_strlcpy(write, val, space);
                    space_needed += slen;
                    if (slen < space) {
                        space -= slen;
                        write += slen;
                    }
                    else {
                        /* buffer is full */
                        write += space - 1;
                        space = 0;
                    }
                }
                else {
                    /* token not found, copy [pos, copy] to output instead */
                    size_t bytes = keylen + 2;
                    space_needed += bytes;
                    if (bytes >= space) {
                        bytes = space - 1;
                    }
                    str_strlcpy(write, pos, bytes + 1);
                    write += bytes;
                    space -= bytes;
                }
                pos = copy++;
            }
        }
        else {
            /** backslash escapes the next character */
            ++space_needed;
            if (pos[1]) ++pos;
            if (space > 1) {
                *write++ = *pos;
                --space;
            }
            copy = pos + 1;
        }
    }
    if (copy < pos) {
        space_needed += str_strlcpy(write, copy, space);
    }
    return space_needed;
}